

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall mognetwork::Selector::waitForTrigger(Selector *this)

{
  int iVar1;
  long in_RDI;
  Selector *in_stack_00000030;
  Selector *in_stack_00000050;
  
  *(undefined4 *)(in_RDI + 0x70) = 0;
  setFds(in_stack_00000050);
  iVar1 = select(*(int *)(in_RDI + 0x178) + 1,(fd_set *)(in_RDI + 0x78),(fd_set *)(in_RDI + 0xf8),
                 (fd_set *)0x0,*(timeval **)(in_RDI + 8));
  if (iVar1 == -1) {
    *(undefined4 *)(in_RDI + 0x70) = 1;
  }
  else {
    updateFds(in_stack_00000030);
  }
  return;
}

Assistant:

void Selector::waitForTrigger()
  {
    m_state = Waiting;
    setFds();
#ifndef OS_WINDOWS
    if (select(m_maxFds + 1, &m_rdfs, &m_wdfs, NULL, m_timeout) == -1)
	{
#else
	if (select(m_maxFds + 1, &m_rdfs, &m_wdfs, NULL, m_timeout) == SOCKET_ERROR)
	{
#endif // !OS_WINDOWS
		m_state = Error;
	}
    else
      updateFds();
  }
}